

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  void *__addr;
  ulong *puVar8;
  __sighandler_t p_Var9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _union_1457 _Var12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar13;
  _union_1457 *p_Var14;
  ulong uVar15;
  undefined8 uVar16;
  const_iterator cVar17;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  string internal_flag;
  ExecDeathTestArgs args_2;
  Arguments args;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  ulong *local_2d8;
  long local_2d0;
  ulong local_2c8;
  long lStack_2c0;
  _union_1457 local_2b8;
  long local_2b0;
  _union_1457 local_2a8;
  long lStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  int local_238;
  int local_234;
  string local_230;
  int local_20c;
  long *local_208;
  undefined8 local_200;
  long local_1f8;
  undefined8 uStack_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  _union_1457 local_160;
  undefined1 local_158 [8];
  ulong local_150;
  ulong uStack_148;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_20c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar2 = pipe(&local_238);
  if (iVar2 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_318 == puVar8) {
      local_308 = *puVar8;
      lStack_300 = puVar6[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar8;
    }
    local_310 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_2d8 == puVar8) {
      local_2c8 = *puVar8;
      lStack_2c0 = puVar6[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar8;
    }
    local_2d0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8;
    }
    if (uVar15 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar16 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_0016fca5;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0016fca5:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar11) {
      local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
      lStack_2a0 = puVar6[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
    }
    local_2b0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_160.sa_handler == p_Var9) {
      local_150 = *(ulong *)p_Var9;
      uStack_148 = puVar6[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var9;
    }
    local_158 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
LAB_001701a6:
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar11) goto LAB_0016fa6f;
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_0016fa7a;
  }
  iVar2 = fcntl(local_234,2,0);
  if (iVar2 == -1) {
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"CHECK failed: File ","");
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
    local_318 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_318 == puVar8) {
      local_308 = *puVar8;
      lStack_300 = puVar6[3];
      local_318 = &local_308;
    }
    else {
      local_308 = *puVar8;
    }
    local_310 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
    local_2d8 = (ulong *)*puVar6;
    puVar8 = puVar6 + 2;
    if (local_2d8 == puVar8) {
      local_2c8 = *puVar8;
      lStack_2c0 = puVar6[3];
      local_2d8 = &local_2c8;
    }
    else {
      local_2c8 = *puVar8;
    }
    local_2d0 = puVar6[1];
    *puVar6 = puVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_278._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>((string *)&local_298,(int *)&local_278);
    uVar15 = 0xf;
    if (local_2d8 != &local_2c8) {
      uVar15 = local_2c8;
    }
    if (uVar15 < (ulong)(local_298._8_8_ + local_2d0)) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity != &local_288) {
        uVar16 = local_288._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (ulong)(local_298._8_8_ + local_2d0)) goto LAB_0016fd9b;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,(ulong)local_2d8);
    }
    else {
LAB_0016fd9b:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d8,local_298._M_allocated_capacity);
    }
    local_2b8.sa_handler = (__sighandler_t)*puVar6;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8.sa_handler == paVar11) {
      local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
      lStack_2a0 = puVar6[3];
      local_2b8.sa_handler = (__sighandler_t)&local_2a8;
    }
    else {
      local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
    }
    local_2b0 = puVar6[1];
    *puVar6 = paVar11;
    puVar6[1] = 0;
    paVar11->_M_local_buf[0] = '\0';
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
    local_160.sa_handler = (__sighandler_t)*puVar6;
    p_Var9 = (__sighandler_t)(puVar6 + 2);
    if (local_160.sa_handler == p_Var9) {
      local_150 = *(ulong *)p_Var9;
      uStack_148 = puVar6[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var9;
    }
    local_158 = (undefined1  [8])puVar6[1];
    *puVar6 = p_Var9;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    goto LAB_001701a6;
  }
  local_2f8 = &local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_308 = *puVar8;
    lStack_300 = plVar5[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar8;
    local_318 = (ulong *)*plVar5;
  }
  local_310 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_318);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2c8 = *puVar8;
    lStack_2c0 = plVar5[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar8;
    local_2d8 = (ulong *)*plVar5;
  }
  local_2d0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var14 = (_union_1457 *)(plVar5 + 2);
  if ((_union_1457 *)*plVar5 == p_Var14) {
    local_2a8 = *p_Var14;
    lStack_2a0 = plVar5[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = *p_Var14;
    local_2b8.sa_handler = (__sighandler_t)*plVar5;
  }
  local_2b0 = plVar5[1];
  *plVar5 = (long)p_Var14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if ((__sighandler_t)*plVar5 == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = plVar5[3];
  }
  else {
    local_150 = *(ulong *)p_Var9;
    local_160.sa_handler = (__sighandler_t)*plVar5;
  }
  local_158 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar6;
  }
  local_c0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180 = &local_170;
  plVar10 = plVar5 + 2;
  if ((long *)*plVar5 == plVar10) {
    local_170 = *plVar10;
    lStack_168 = plVar5[3];
  }
  else {
    local_170 = *plVar10;
    local_180 = (long *)*plVar5;
  }
  local_178 = plVar5[1];
  *plVar5 = (long)plVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_258.field_2._M_allocated_capacity = *puVar8;
    local_258.field_2._8_8_ = plVar5[3];
  }
  else {
    local_258.field_2._M_allocated_capacity = *puVar8;
    local_258._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_258._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278.field_2._8_8_ = plVar5[3];
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = (size_type)&local_288;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar11) {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_288._8_8_ = plVar5[3];
  }
  else {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_298._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar5;
  }
  local_298._8_8_ = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_298._M_local_buf);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_2e8 = *puVar8;
    lStack_2e0 = plVar5[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar8;
    local_2f8 = (ulong *)*plVar5;
  }
  local_2f0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_308 = *puVar8;
    lStack_300 = plVar5[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar8;
    local_318 = (ulong *)*plVar5;
  }
  local_310 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_1c8,&this->line_);
  uVar15 = 0xf;
  if (local_318 != &local_308) {
    uVar15 = local_308;
  }
  if (uVar15 < local_1c8._M_string_length + local_310) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      uVar16 = local_1c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_1c8._M_string_length + local_310) goto LAB_0016eadc;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_0016eadc:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_1c8._M_dataplus._M_p);
  }
  puVar8 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar8) {
    local_2c8 = *puVar8;
    lStack_2c0 = puVar6[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar8;
    local_2d8 = (ulong *)*puVar6;
  }
  local_2d0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  p_Var14 = (_union_1457 *)(plVar5 + 2);
  if ((_union_1457 *)*plVar5 == p_Var14) {
    local_2a8.sa_handler = p_Var14->sa_handler;
    lStack_2a0 = plVar5[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8.sa_handler = p_Var14->sa_handler;
    local_2b8.sa_handler = (__sighandler_t)*plVar5;
  }
  local_2b0 = plVar5[1];
  *plVar5 = (long)p_Var14;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  StreamableToString<int>(&local_1e8,&local_20c);
  p_Var9 = (__sighandler_t)
           (CONCAT44(local_1e8._M_string_length._4_4_,(int)local_1e8._M_string_length) + local_2b0);
  _Var12 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    _Var12 = local_2a8;
  }
  if ((ulong)_Var12 < p_Var9) {
    uVar16 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < p_Var9) goto LAB_0016ebef;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_0016ebef:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var9 = (__sighandler_t)(puVar6 + 2);
  if ((__sighandler_t)*puVar6 == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = puVar6[3];
  }
  else {
    local_150 = *(ulong *)p_Var9;
    local_160.sa_handler = (__sighandler_t)*puVar6;
  }
  local_158 = (undefined1  [8])puVar6[1];
  *puVar6 = p_Var9;
  puVar6[1] = 0;
  *p_Var9 = (__sighandler_t)0x0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar6;
  }
  local_c0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  StreamableToString<int>(&local_1a0,&local_234);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar16 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_c0 + local_1a0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
        &local_1a0.field_2) {
      uVar16 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_c0 + local_1a0._M_string_length) goto LAB_0016ed38;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0016ed38:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        (ulong)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                        local_1a0._M_dataplus._M_p._0_4_));
  }
  local_208 = &local_1f8;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_1f8 = *plVar5;
    uStack_1f0 = puVar6[3];
  }
  else {
    local_1f8 = *plVar5;
    local_208 = (long *)*puVar6;
  }
  local_200 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
      &local_1a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                    local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,(ulong)(local_1e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_union_1457 *)local_2b8.sa_handler != &local_2a8) {
    operator_delete(local_2b8.sa_handler,(ulong)(local_2a8.sa_handler + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != &local_308) {
    operator_delete(local_318,local_308 + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,local_2e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    operator_delete((void *)local_298._M_allocated_capacity,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_c8.sa_handler = (__sighandler_t)0x0;
  std::vector<char*,std::allocator<char*>>::emplace_back<char*>
            ((vector<char*,std::allocator<char*>> *)&local_1c8,(char **)&local_c8.sa_handler);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_c8,__x);
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  cVar17._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_180);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar17,
             (value_type *)&local_c8.sa_handler);
  cVar17._M_current = (char **)(local_1c8._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_208);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1c8,cVar17,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_1e8._M_dataplus._M_p = local_1c8._M_dataplus._M_p;
  local_1e8._M_string_length._0_4_ = local_238;
  memset(&local_160,0,0x98);
  sigemptyset((sigset_t *)local_158);
  local_160 = (_union_1457)0x1;
  do {
    iVar2 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)&local_c8);
    if (iVar2 != -1) {
      if (FLAGS_gtest_death_test_use_fork != '\0') {
        iVar2 = fork();
        if (iVar2 == 0) {
          ExecDeathTestChildMain(&local_1e8);
          goto LAB_0016fdb7;
        }
LAB_0016f1fa:
        goto LAB_0016f202;
      }
      if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_0016fdb7:
        AssumeRole();
      }
      uVar3 = getpagesize();
      __len = (size_t)(int)uVar3;
      __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
      if (__addr == (void *)0xffffffffffffffff) {
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"CHECK failed: File ","");
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
        local_298._M_allocated_capacity = *puVar6;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity == paVar11) {
          local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_288._8_8_ = puVar6[3];
          local_298._M_allocated_capacity = (size_type)&local_288;
        }
        else {
          local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        }
        local_298._8_8_ = puVar6[1];
        *puVar6 = paVar11;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
        local_2f8 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_2f8 == puVar8) {
          local_2e8 = *puVar8;
          lStack_2e0 = puVar6[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *puVar8;
        }
        local_2f0 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x55b;
        StreamableToString<int>(&local_258,(int *)&local_230);
        uVar15 = 0xf;
        if (local_2f8 != &local_2e8) {
          uVar15 = local_2e8;
        }
        if (uVar15 < local_258._M_string_length + local_2f0) {
          uVar16 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            uVar16 = local_258.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < local_258._M_string_length + local_2f0) goto LAB_001702db;
          puVar6 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_001702db:
          puVar6 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
        }
        local_318 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_318 == puVar8) {
          local_308 = *puVar8;
          lStack_300 = puVar6[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar8;
        }
        local_310 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
        local_2d8 = (ulong *)*puVar6;
        puVar8 = puVar6 + 2;
        if (local_2d8 == puVar8) {
          local_2c8 = *puVar8;
          lStack_2c0 = puVar6[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *puVar8;
        }
        local_2d0 = puVar6[1];
        *puVar6 = puVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
      }
      else {
        lVar13 = 0;
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
          lVar13 = __len - 0x40;
        }
        if ((uVar3 < 0x41) || (((ulong)(lVar13 + (long)__addr) & 0x3f) != 0)) {
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar6;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar11) {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_288._8_8_ = puVar6[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar6[1];
          *puVar6 = paVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2f8 == puVar8) {
            local_2e8 = *puVar8;
            lStack_2e0 = puVar6[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar8;
          }
          local_2f0 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x569;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar15 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar15 = local_2e8;
          }
          if (uVar15 < local_258._M_string_length + local_2f0) {
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar16 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_258._M_string_length + local_2f0) goto LAB_001703e7;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_001703e7:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_318 == puVar8) {
            local_308 = *puVar8;
            lStack_300 = puVar6[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar8;
          }
          local_310 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)puVar8 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2d8 == puVar8) {
            local_2c8 = *puVar8;
            lStack_2c0 = puVar6[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar8;
          }
          local_2d0 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
        }
        else {
          iVar2 = clone(ExecDeathTestChildMain,(void *)(lVar13 + (long)__addr),0x11,&local_1e8);
          iVar4 = munmap(__addr,__len);
          if (iVar4 != -1) goto LAB_0016f1fa;
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_278,"CHECK failed: File ","");
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_allocated_capacity = *puVar6;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_allocated_capacity == paVar11) {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_288._8_8_ = puVar6[3];
            local_298._M_allocated_capacity = (size_type)&local_288;
          }
          else {
            local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_298._8_8_ = puVar6[1];
          *puVar6 = paVar11;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
          local_2f8 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2f8 == puVar8) {
            local_2e8 = *puVar8;
            lStack_2e0 = puVar6[3];
            local_2f8 = &local_2e8;
          }
          else {
            local_2e8 = *puVar8;
          }
          local_2f0 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_258,(int *)&local_230);
          uVar15 = 0xf;
          if (local_2f8 != &local_2e8) {
            uVar15 = local_2e8;
          }
          if (uVar15 < local_258._M_string_length + local_2f0) {
            uVar16 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              uVar16 = local_258.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < local_258._M_string_length + local_2f0) goto LAB_001704f3;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8)
            ;
          }
          else {
LAB_001704f3:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
          }
          local_318 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_318 == puVar8) {
            local_308 = *puVar8;
            lStack_300 = puVar6[3];
            local_318 = &local_308;
          }
          else {
            local_308 = *puVar8;
          }
          local_310 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)puVar8 = 0;
          puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
          local_2d8 = (ulong *)*puVar6;
          puVar8 = puVar6 + 2;
          if (local_2d8 == puVar8) {
            local_2c8 = *puVar8;
            lStack_2c0 = puVar6[3];
            local_2d8 = &local_2c8;
          }
          else {
            local_2c8 = *puVar8;
          }
          local_2d0 = puVar6[1];
          *puVar6 = puVar8;
          puVar6[1] = 0;
          *(undefined1 *)(puVar6 + 2) = 0;
        }
      }
      goto LAB_0016f8c9;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*plVar5;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)local_278._M_dataplus._M_p == puVar8) {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278.field_2._8_8_ = plVar5[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar8;
  }
  local_278._M_string_length = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *plVar5;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar11) {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_288._8_8_ = plVar5[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_298._8_8_ = plVar5[1];
  *plVar5 = (long)paVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar16 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) goto LAB_0016f4aa;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_0016f4aa:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f8 == puVar8) {
    local_2e8 = *puVar8;
    lStack_2e0 = puVar6[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar8;
  }
  local_2f0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_318 == puVar8) {
    local_308 = *puVar8;
    lStack_300 = puVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar8;
  }
  local_310 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  goto LAB_0016f86e;
LAB_0016f297:
  do {
    iVar4 = close(local_234);
    if (iVar4 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar2;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_238;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1c8);
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180,local_170 + 1);
      }
      return OVERSEE_TEST;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  local_298._M_allocated_capacity = (size_type)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
  local_2f8 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f8 == puVar8) {
    local_2e8 = *puVar8;
    lStack_2e0 = puVar6[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar8;
  }
  local_2f0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_318 == puVar8) {
    local_308 = *puVar8;
    lStack_300 = puVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar8;
  }
  local_310 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_258._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_278,(int *)&local_258);
  uVar15 = 0xf;
  if (local_318 != &local_308) {
    uVar15 = local_308;
  }
  if (uVar15 < local_278._M_string_length + local_310) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      uVar16 = local_278.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_278._M_string_length + local_310) goto LAB_0016f6da;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_318);
  }
  else {
LAB_0016f6da:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_278._M_dataplus._M_p);
  }
  local_2d8 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2d8 == puVar8) {
    local_2c8 = *puVar8;
    lStack_2c0 = puVar6[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar8;
  }
  local_2d0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar11) {
    local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
    lStack_2a0 = puVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
  }
  local_2b0 = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_160.sa_handler = (__sighandler_t)*plVar5;
  p_Var9 = (__sighandler_t)(plVar5 + 2);
  if (local_160.sa_handler == p_Var9) {
    local_150 = *(ulong *)p_Var9;
    uStack_148 = plVar5[3];
    local_160.sa_handler = (__sighandler_t)&local_150;
  }
  else {
    local_150 = *(ulong *)p_Var9;
  }
  local_158 = (undefined1  [8])plVar5[1];
  *plVar5 = (long)p_Var9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
  local_c8.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar11) {
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar6[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_0016fa6f:
    local_b8[0]._0_8_ = paVar11->_M_allocated_capacity;
  }
LAB_0016fa7a:
  _Var12 = *(_union_1457 *)(puVar6 + 1);
  p_Var14 = &local_c8;
  goto LAB_0016fa86;
  while (piVar7 = __errno_location(), *piVar7 == 4) {
LAB_0016f202:
    iVar4 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar4 != -1) {
      if (iVar2 != -1) goto LAB_0016f297;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"CHECK failed: File ","")
      ;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_allocated_capacity = *puVar6;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_allocated_capacity == paVar11) {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_288._8_8_ = puVar6[3];
        local_298._M_allocated_capacity = (size_type)&local_288;
      }
      else {
        local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_298._8_8_ = puVar6[1];
      *puVar6 = paVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_298._M_local_buf);
      local_2f8 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_2f8 == puVar8) {
        local_2e8 = *puVar8;
        lStack_2e0 = puVar6[3];
        local_2f8 = &local_2e8;
      }
      else {
        local_2e8 = *puVar8;
      }
      local_2f0 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_258,(int *)&local_230);
      uVar15 = 0xf;
      if (local_2f8 != &local_2e8) {
        uVar15 = local_2e8;
      }
      if (uVar15 < local_258._M_string_length + local_2f0) {
        uVar16 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar16 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < local_258._M_string_length + local_2f0) goto LAB_00170008;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_258,0,(char *)0x0,(ulong)local_2f8);
      }
      else {
LAB_00170008:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f8,(ulong)local_258._M_dataplus._M_p);
      }
      local_318 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_318 == puVar8) {
        local_308 = *puVar8;
        lStack_300 = puVar6[3];
        local_318 = &local_308;
      }
      else {
        local_308 = *puVar8;
      }
      local_310 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)puVar8 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
      local_2d8 = (ulong *)*puVar6;
      puVar8 = puVar6 + 2;
      if (local_2d8 == puVar8) {
        local_2c8 = *puVar8;
        lStack_2c0 = puVar6[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8 = *puVar8;
      }
      local_2d0 = puVar6[1];
      *puVar6 = puVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      goto LAB_0016f8c9;
    }
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*puVar6;
  puVar8 = puVar6 + 2;
  if ((ulong *)local_278._M_dataplus._M_p == puVar8) {
    local_278.field_2._M_allocated_capacity = *puVar8;
    local_278.field_2._8_8_ = puVar6[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar8;
  }
  local_278._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_allocated_capacity = *puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity == paVar11) {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_288._8_8_ = puVar6[3];
    local_298._M_allocated_capacity = (size_type)&local_288;
  }
  else {
    local_288._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_298._8_8_ = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_allocated_capacity != &local_288) {
    uVar16 = local_288._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar16 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_230._M_string_length + local_298._8_8_) goto LAB_0016f5d7;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,local_298._M_allocated_capacity);
  }
  else {
LAB_0016f5d7:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_298._M_local_buf,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f8 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2f8 == puVar8) {
    local_2e8 = *puVar8;
    lStack_2e0 = puVar6[3];
    local_2f8 = &local_2e8;
  }
  else {
    local_2e8 = *puVar8;
  }
  local_2f0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f8);
  local_318 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_318 == puVar8) {
    local_308 = *puVar8;
    lStack_300 = puVar6[3];
    local_318 = &local_308;
  }
  else {
    local_308 = *puVar8;
  }
  local_310 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
LAB_0016f86e:
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_318);
  local_2d8 = (ulong *)*puVar6;
  puVar8 = puVar6 + 2;
  if (local_2d8 == puVar8) {
    local_2c8 = *puVar8;
    lStack_2c0 = puVar6[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8 = *puVar8;
  }
  local_2d0 = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
LAB_0016f8c9:
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
  local_2b8.sa_handler = (__sighandler_t)*puVar6;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8.sa_handler == paVar11) {
    local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
    lStack_2a0 = puVar6[3];
    local_2b8.sa_handler = (__sighandler_t)&local_2a8;
  }
  else {
    local_2a8 = (_union_1457)paVar11->_M_allocated_capacity;
  }
  _Var12 = *(_union_1457 *)(puVar6 + 1);
  p_Var14 = &local_2b8;
LAB_0016fa86:
  p_Var14[1] = _Var12;
  *puVar6 = paVar11;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  DeathTestAbort((string *)p_Var14);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}